

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

Calendar * __thiscall
icu_63::RelativeDateFormat::initializeCalendar
          (RelativeDateFormat *this,TimeZone *adoptZone,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  Calendar *pCVar2;
  TimeZone *local_38;
  UErrorCode *status_local;
  Locale *locale_local;
  TimeZone *adoptZone_local;
  RelativeDateFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    local_38 = adoptZone;
    if (adoptZone == (TimeZone *)0x0) {
      local_38 = TimeZone::createDefault();
    }
    pCVar2 = Calendar::createInstance(local_38,locale,status);
    (this->super_DateFormat).fCalendar = pCVar2;
  }
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && ((this->super_DateFormat).fCalendar == (Calendar *)0x0)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (this->super_DateFormat).fCalendar;
}

Assistant:

Calendar*
RelativeDateFormat::initializeCalendar(TimeZone* adoptZone, const Locale& locale, UErrorCode& status)
{
    if(!U_FAILURE(status)) {
        fCalendar = Calendar::createInstance(adoptZone?adoptZone:TimeZone::createDefault(), locale, status);
    }
    if (U_SUCCESS(status) && fCalendar == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return fCalendar;
}